

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RegexMatcher::replaceAll
          (UnicodeString *__return_storage_ptr__,RegexMatcher *this,UnicodeString *replacement,
          UErrorCode *status)

{
  UBool UVar1;
  undefined1 auStack_148 [8];
  UText resultText;
  UText replacementText;
  UErrorCode *status_local;
  UnicodeString *replacement_local;
  RegexMatcher *this_local;
  UnicodeString *resultString;
  
  resultText.privB = 0x345ad82c;
  resultText.privC = 0;
  resultText.b = 0;
  resultText.c = 0;
  resultText.privA = 0;
  resultText.privP = (void *)0x0;
  resultText.a = 0;
  resultText.q = (void *)0x0;
  resultText.r = (void *)0x0;
  resultText.context = (void *)0x0;
  resultText.p = (void *)0x0;
  resultText.pFuncs = (UTextFuncs *)0x0;
  resultText.pExtra = (void *)0x0;
  resultText.chunkOffset = 0;
  resultText.chunkLength = 0;
  resultText.chunkContents = (UChar *)0x0;
  resultText.extraSize = 0;
  resultText.nativeIndexingLimit = 0;
  resultText.chunkNativeStart = 0;
  resultText.providerProperties = 0;
  resultText.sizeOfStruct = 0;
  resultText.chunkNativeLimit = 0;
  auStack_148._0_4_ = 0x345ad82c;
  auStack_148._4_4_ = 0;
  resultText.magic = 0;
  resultText.flags = 0x90;
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    utext_openConstUnicodeString_63((UText *)&resultText.privB,replacement,status);
    utext_openUnicodeString_63((UText *)auStack_148,__return_storage_ptr__,status);
    replaceAll(this,(UText *)&resultText.privB,(UText *)auStack_148,status);
    utext_close_63((UText *)auStack_148);
    utext_close_63((UText *)&resultText.privB);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RegexMatcher::replaceAll(const UnicodeString &replacement, UErrorCode &status) {
    UText replacementText = UTEXT_INITIALIZER;
    UText resultText = UTEXT_INITIALIZER;
    UnicodeString resultString;
    if (U_FAILURE(status)) {
        return resultString;
    }

    utext_openConstUnicodeString(&replacementText, &replacement, &status);
    utext_openUnicodeString(&resultText, &resultString, &status);

    replaceAll(&replacementText, &resultText, status);

    utext_close(&resultText);
    utext_close(&replacementText);

    return resultString;
}